

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::UnsafeArenaSetAllocatedMessage
          (Reflection *this,Message *message,Message *sub_message,FieldDescriptor *field)

{
  int number;
  undefined4 uVar1;
  OneofDescriptor *oneof_descriptor;
  long lVar2;
  long *plVar3;
  uint32 uVar4;
  ulong uVar5;
  LogMessage *other;
  char cVar6;
  LogMessage local_70;
  FieldDescriptor *local_38;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetAllocatedMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetAllocatedMessage",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_70._0_8_ = FieldDescriptor::TypeOnceInit;
    local_38 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_70,&local_38)
    ;
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetAllocatedMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x43] == (FieldDescriptor)0x1) {
    uVar4 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    number = *(int *)(field + 0x44);
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_70._0_8_ = FieldDescriptor::TypeOnceInit;
      local_38 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_70,
                 &local_38);
    }
    internal::ExtensionSet::UnsafeArenaSetAllocatedMessage
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),number,
               (FieldType)field[0x38],field,&sub_message->super_MessageLite);
  }
  else {
    oneof_descriptor = *(OneofDescriptor **)(field + 0x58);
    if ((oneof_descriptor == (OneofDescriptor *)0x0) ||
       ((*(int *)(oneof_descriptor + 0x18) == 1 &&
        (*(char *)(**(long **)(oneof_descriptor + 0x20) + 0x41) != '\0')))) {
      if (sub_message == (Message *)0x0) {
        ClearBit(this,message,field);
      }
      else {
        SetBit(this,message,field);
      }
      uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar5 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                        (ulong)(uint)(this->schema_).metadata_offset_);
      if ((uVar5 & 1) != 0) {
        uVar5 = *(ulong *)(uVar5 & 0xfffffffffffffffe);
      }
      if ((uVar5 == 0) &&
         (plVar3 = *(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
         plVar3 != (long *)0x0)) {
        (**(code **)(*plVar3 + 8))();
      }
      *(Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4) =
           sub_message;
    }
    else {
      ClearOneof(this,message,oneof_descriptor);
      if (sub_message != (Message *)0x0) {
        uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
        *(Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4) =
             sub_message;
        lVar2 = *(long *)(field + 0x58);
        if (*(int *)(lVar2 + 0x18) == 1) {
          cVar6 = *(char *)(**(long **)(lVar2 + 0x20) + 0x41);
        }
        else {
          cVar6 = '\0';
        }
        uVar1 = *(undefined4 *)(field + 0x44);
        if (cVar6 != '\0') {
          internal::LogMessage::LogMessage
                    (&local_70,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/generated_message_reflection.cc"
                     ,0x768);
          other = internal::LogMessage::operator<<
                            (&local_70,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_38,other);
          if (cVar6 != '\0') {
            internal::LogMessage::~LogMessage(&local_70);
          }
        }
        *(undefined4 *)
         ((long)&(message->super_MessageLite)._vptr_MessageLite +
         (ulong)(uint)((int)((ulong)(lVar2 - *(long *)(*(long *)(lVar2 + 0x10) + 0x30)) >> 4) *
                       -0x55555554 + (this->schema_).oneof_case_offset_)) = uVar1;
      }
    }
  }
  return;
}

Assistant:

void Reflection::UnsafeArenaSetAllocatedMessage(
    Message* message, Message* sub_message,
    const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(SetAllocatedMessage, SINGULAR, MESSAGE);

  if (field->is_extension()) {
    MutableExtensionSet(message)->UnsafeArenaSetAllocatedMessage(
        field->number(), field->type(), field, sub_message);
  } else {
    if (schema_.InRealOneof(field)) {
      if (sub_message == nullptr) {
        ClearOneof(message, field->containing_oneof());
        return;
      }
        ClearOneof(message, field->containing_oneof());
        *MutableRaw<Message*>(message, field) = sub_message;
      SetOneofCase(message, field);
      return;
    }

    if (sub_message == nullptr) {
      ClearBit(message, field);
    } else {
      SetBit(message, field);
    }
    Message** sub_message_holder = MutableRaw<Message*>(message, field);
    if (GetArena(message) == nullptr) {
      delete *sub_message_holder;
    }
    *sub_message_holder = sub_message;
  }
}